

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

int __thiscall pbrt::Camera::writeTo(Camera *this,BinaryWriter *binary)

{
  BinaryWriter::writeRaw(binary,&this->fov,4);
  BinaryWriter::writeRaw(binary,&this->focalDistance,4);
  BinaryWriter::writeRaw(binary,&this->lensRadius,4);
  BinaryWriter::writeRaw(binary,&this->frame,0x30);
  BinaryWriter::writeRaw(binary,&this->simplified,0x48);
  return 5;
}

Assistant:

int Camera::writeTo(BinaryWriter &binary) 
  {
    binary.write(fov);
    binary.write(focalDistance);
    binary.write(lensRadius);
    binary.write(frame);
    binary.write(simplified);
    return TYPE_CAMERA;
  }